

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cc
# Opt level: O1

ostream * avro::operator<<(ostream *os,Type type)

{
  if ((uint)type < 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,*(char **)(strings::typeToString_abi_cxx11_ + (ulong)(uint)type * 0x20),
               *(long *)(strings::typeToString_abi_cxx11_ + (ulong)(uint)type * 0x20 + 8));
  }
  else {
    std::ostream::operator<<(os,type);
  }
  return os;
}

Assistant:

std::ostream &operator<< (std::ostream &os, Type type)
{
    if(isAvroTypeOrPseudoType(type)) {
        os << strings::typeToString[type];
    }
    else {
        os << static_cast<int>(type);
    }
    return os;
}